

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobjectmanager.cpp
# Opt level: O0

RHANDLE PAL_LocalHandleToRemote(HANDLE hLocal)

{
  CSharedMemoryObject *this;
  bool bVar1;
  SHMPTR shmptr;
  LPVOID pvVar2;
  RHANDLE local_40;
  RHANDLE hRemote;
  SHMObjData *psmod;
  CSharedMemoryObject *pshmobj;
  IPalObject *pobj;
  CPalThread *pthr;
  undefined1 *puStack_10;
  PAL_ERROR palError;
  HANDLE hLocal_local;
  
  pthr._4_4_ = 0;
  pshmobj = (CSharedMemoryObject *)0x0;
  local_40 = (RHANDLE)&DAT_ffffffffffffffff;
  puStack_10 = (undefined1 *)hLocal;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pobj = (IPalObject *)CorUnix::InternalGetCurrentThread();
  bVar1 = CorUnix::HandleIsSpecial(puStack_10);
  if (bVar1) {
    if (puStack_10 != &DAT_ffffff01) {
      fprintf(_stderr,"] %s %s:%d","PAL_LocalHandleToRemote",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
              ,0x4c9);
      fprintf(_stderr,"Invalid special handle type passed to PAL_LocalHandleToRemote\n");
      pthr._4_4_ = 6;
      goto LAB_003b596d;
    }
    pshmobj = CorUnix::g_pobjProcess;
    (*(CorUnix::g_pobjProcess->super_CPalObjectBase).super_IPalObject._vptr_IPalObject[7])();
  }
  else {
    pthr._4_4_ = (**(code **)(*CorUnix::g_pObjectManager + 0x28))
                           (CorUnix::g_pObjectManager,pobj,puStack_10,&aotRemotable,0,&pshmobj);
    if (pthr._4_4_ != 0) goto LAB_003b596d;
    pthr._4_4_ = 0;
  }
  this = pshmobj;
  pthr._4_4_ = (*(pshmobj->super_CPalObjectBase).super_IPalObject._vptr_IPalObject[0x11])
                         (pshmobj,pobj);
  if (pthr._4_4_ == 0) {
    SHMLock();
    shmptr = CorUnix::CSharedMemoryObject::GetShmObjData(this);
    pvVar2 = SHMPtrToPtr(shmptr);
    if (pvVar2 == (LPVOID)0x0) {
      fprintf(_stderr,"] %s %s:%d","PAL_LocalHandleToRemote",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
              ,0x4f0);
      fprintf(_stderr,"Unable to map shared object data\n");
      pthr._4_4_ = 0x54f;
    }
    else {
      *(int *)((long)pvVar2 + 0x30) = *(int *)((long)pvVar2 + 0x30) + 1;
      local_40 = (RHANDLE)CorUnix::CSharedMemoryObject::GetShmObjData(this);
    }
    SHMRelease();
  }
  else if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
LAB_003b596d:
  if (pshmobj != (CSharedMemoryObject *)0x0) {
    (*(pshmobj->super_CPalObjectBase).super_IPalObject._vptr_IPalObject[8])(pshmobj,pobj);
  }
  if (pthr._4_4_ != 0) {
    CorUnix::CPalThread::SetLastError(pthr._4_4_);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return local_40;
  }
  abort();
}

Assistant:

PALIMPORT
RHANDLE
PALAPI
PAL_LocalHandleToRemote(IN HANDLE hLocal)
{
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pthr;
    IPalObject *pobj = NULL;
    CSharedMemoryObject *pshmobj;
    SHMObjData *psmod = NULL;
    RHANDLE hRemote = reinterpret_cast<RHANDLE>(INVALID_HANDLE_VALUE);

    PERF_ENTRY(PAL_LocalHandleToRemote);
    ENTRY("PAL_LocalHandleToRemote( hLocal=0x%lx )\n", hLocal);

    pthr = InternalGetCurrentThread();

    if (!HandleIsSpecial(hLocal))
    {
        palError = g_pObjectManager->ReferenceObjectByHandle(
            pthr,
            hLocal,
            &aotRemotable,
            0,
            &pobj
            );

        if (NO_ERROR != palError)
        {
            goto PAL_LocalHandleToRemoteExitNoLockRelease;
        }
    }
    else if (hPseudoCurrentProcess == hLocal)
    {
        pobj = g_pobjProcess;
        pobj->AddReference();
    }
    else
    {
        ASSERT("Invalid special handle type passed to PAL_LocalHandleToRemote\n");
        palError = ERROR_INVALID_HANDLE;
        goto PAL_LocalHandleToRemoteExitNoLockRelease;
    }

    pshmobj = static_cast<CSharedMemoryObject*>(pobj);

    //
    // Make sure that the object is shared
    //

    palError = pshmobj->EnsureObjectIsShared(pthr);
    if (NO_ERROR != palError)
    {
        ERROR("Failure %d promoting object\n", palError);
        goto PAL_LocalHandleToRemoteExitNoLockRelease;
    }

    SHMLock();
    
    psmod = SHMPTR_TO_TYPED_PTR(SHMObjData, pshmobj->GetShmObjData());
    if (NULL != psmod)
    {
        //
        // Bump up the process ref count by 1. The receiving process will not
        // increase the ref count when it converts the remote handle to
        // local.
        //
        
        psmod->lProcessRefCount += 1;

        //
        // The remote handle is simply the SHMPTR for the SHMObjData
        //

        hRemote = reinterpret_cast<RHANDLE>(pshmobj->GetShmObjData());
    }
    else
    {
        ASSERT("Unable to map shared object data\n");
        palError = ERROR_INTERNAL_ERROR;
        goto PAL_LocalHandleToRemoteExit;
    }

PAL_LocalHandleToRemoteExit:

    SHMRelease();

PAL_LocalHandleToRemoteExitNoLockRelease:

    if (NULL != pobj)
    {
        pobj->ReleaseReference(pthr);
    }

    if (NO_ERROR != palError)
    {
        pthr->SetLastError(palError);
    }
    
    LOGEXIT("PAL_LocalHandleToRemote returns RHANDLE 0x%lx\n", hRemote);
    PERF_EXIT(PAL_LocalHandleToRemote);
    return hRemote;
}